

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

void Open_JTalk_COPYRIGHT(void)

{
  fprintf(_stderr,"The Japanese TTS System \"Open JTalk\"\n");
  fprintf(_stderr,"Version 1.10 (http://open-jtalk.sourceforge.net/)\n");
  fprintf(_stderr,"Copyright (C) 2008-2016 Nagoya Institute of Technology\n");
  fprintf(_stderr,"All rights reserved.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"%s",
          "The HMM-Based Speech Synthesis Engine \"hts_engine API\"\nVersion 1.10 (http://hts-engine.sourceforge.net/)\nCopyright (C) 2001-2015 Nagoya Institute of Technology\n              2001-2008 Tokyo Institute of Technology\nAll rights reserved.\n"
         );
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Yet Another Part-of-Speech and Morphological Analyzer \"Mecab\"\n");
  fprintf(_stderr,"Version 0.996 (http://mecab.sourceforge.net/)\n");
  fprintf(_stderr,"Copyright (C) 2001-2008 Taku Kudo\n");
  fprintf(_stderr,"              2004-2008 Nippon Telegraph and Telephone Corporation\n");
  fprintf(_stderr,"All rights reserved.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"NAIST Japanese Dictionary\n");
  fprintf(_stderr,"Version 0.6.1-20090630 (http://naist-jdic.sourceforge.jp/)\n");
  fprintf(_stderr,"Copyright (C) 2009 Nara Institute of Science and Technology\n");
  fprintf(_stderr,"All rights reserved.\n");
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void Open_JTalk_COPYRIGHT()
{
	fprintf(stderr, "The Japanese TTS System \"Open JTalk\"\n");
	fprintf(stderr, "Version 1.10 (http://open-jtalk.sourceforge.net/)\n");
	fprintf(stderr, "Copyright (C) 2008-2016 Nagoya Institute of Technology\n");
	fprintf(stderr, "All rights reserved.\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "%s", HTS_COPYRIGHT);
	fprintf(stderr, "\n");
	fprintf(stderr, "Yet Another Part-of-Speech and Morphological Analyzer \"Mecab\"\n");
	fprintf(stderr, "Version 0.996 (http://mecab.sourceforge.net/)\n");
	fprintf(stderr, "Copyright (C) 2001-2008 Taku Kudo\n");
	fprintf(stderr, "              2004-2008 Nippon Telegraph and Telephone Corporation\n");
	fprintf(stderr, "All rights reserved.\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "NAIST Japanese Dictionary\n");
	fprintf(stderr, "Version 0.6.1-20090630 (http://naist-jdic.sourceforge.jp/)\n");
	fprintf(stderr, "Copyright (C) 2009 Nara Institute of Science and Technology\n");
	fprintf(stderr, "All rights reserved.\n");
	fprintf(stderr, "\n");
}